

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

predictor * __thiscall
Search::predictor::add_to<float>
          (predictor *this,v_array<float> *A,bool *A_is_ptr,float a,bool clear_first)

{
  float *__dest;
  size_t __n;
  float *old_pointer;
  float *__src;
  size_t nmemb;
  float local_34;
  
  if (*A_is_ptr == true) {
    if (clear_first) {
      __src = A->_begin;
      A->_end = __src;
      nmemb = 1;
      __n = 0;
    }
    else {
      __src = A->_begin;
      __n = (long)A->_end - (long)__src;
      nmemb = ((long)__n >> 2) + 1;
    }
    __dest = calloc_or_throw<float>(nmemb);
    A->_begin = __dest;
    A->_end = __dest + nmemb;
    A->end_array = __dest + nmemb;
    memcpy(__dest,__src,__n);
    *A_is_ptr = false;
    A->_begin[nmemb - 1] = a;
  }
  else {
    if (clear_first) {
      v_array<float>::clear(A);
    }
    v_array<float>::push_back(A,&local_34);
  }
  return this;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T a, bool clear_first)
{
  if (A_is_ptr)  // we need to make our own memory
  {
    if (clear_first)
      A.end() = A.begin();
    size_t new_size = clear_first ? 1 : (A.size() + 1);
    make_new_pointer<T>(A, new_size);
    A_is_ptr = false;
    A[new_size - 1] = a;
  }
  else  // we've already allocated our own memory
  {
    if (clear_first)
      A.clear();
    A.push_back(a);
  }
  return *this;
}